

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int32 get_quests(node *root,int32 **qarr,int32 *nph,int32 nquests,int32 depth)

{
  int32 *piVar1;
  int32 *__base;
  long lVar2;
  int iVar3;
  
  while( true ) {
    if (3 < depth && (long)root->nphones < 2) {
      return nquests;
    }
    iVar3 = nquests;
    if (0 < depth) {
      __base = (int32 *)__ckd_calloc__((long)root->nphones,4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                       ,0x2ba);
      iVar3 = root->nphones;
      if (0 < iVar3) {
        piVar1 = root->phoneids;
        lVar2 = 0;
        do {
          __base[lVar2] = piVar1[lVar2];
          lVar2 = lVar2 + 1;
          iVar3 = root->nphones;
        } while (lVar2 < iVar3);
      }
      qsort(__base,(long)iVar3,4,compare);
      nph[nquests] = root->nphones;
      iVar3 = nquests + 1;
      qarr[nquests] = __base;
    }
    if (root->nphones < 2) break;
    nquests = iVar3;
    if (root->left != (node *)0x0) {
      nquests = get_quests(root->left,qarr,nph,iVar3,depth + 1);
    }
    root = root->right;
    if (root == (node_str *)0x0) {
      return nquests;
    }
    depth = depth + 1;
  }
  return iVar3;
}

Assistant:

int32 get_quests(node *root,int32 **qarr,int32 *nph,int32 nquests,int32 depth)
{
    int32 *sortedidx,i;

    if (root->nphones < 2 && depth > 3) return nquests;

    if (depth > 0){
        sortedidx = (int32 *)ckd_calloc(root->nphones,sizeof(int32));
        for (i=0;i<root->nphones;i++) sortedidx[i] = root->phoneids[i];
        qsort(sortedidx,root->nphones,sizeof(int32),compare);
        nph[nquests] = root->nphones;
        qarr[nquests++] = sortedidx;
    }

    if (root->nphones < 2) return nquests;
    if (root->left != NULL) 
        nquests = get_quests(root->left,qarr,nph,nquests,depth+1);
    if (root->right != NULL) 
        nquests = get_quests(root->right,qarr,nph,nquests,depth+1);

    return nquests;
}